

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FixExprList(DbFixer *pFix,ExprList *pList)

{
  int iVar1;
  int iVar2;
  ExprList_item *pEVar3;
  
  if ((pList != (ExprList *)0x0) && (0 < pList->nExpr)) {
    pEVar3 = pList->a;
    iVar2 = 0;
    do {
      iVar1 = sqlite3FixExpr(pFix,pEVar3->pExpr);
      if (iVar1 != 0) {
        return 1;
      }
      iVar2 = iVar2 + 1;
      pEVar3 = pEVar3 + 1;
    } while (iVar2 < pList->nExpr);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixExprList(
  DbFixer *pFix,     /* Context of the fixation */
  ExprList *pList    /* The expression to be fixed to one database */
){
  int i;
  struct ExprList_item *pItem;
  if( pList==0 ) return 0;
  for(i=0, pItem=pList->a; i<pList->nExpr; i++, pItem++){
    if( sqlite3FixExpr(pFix, pItem->pExpr) ){
      return 1;
    }
  }
  return 0;
}